

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

bool cmLibDirsLinked(string *l,string *r)

{
  bool bVar1;
  bool bVar2;
  __type local_76;
  string local_68;
  byte local_41;
  string local_40;
  string *local_20;
  string *r_local;
  string *l_local;
  
  local_20 = r;
  r_local = l;
  bVar2 = cmsys::SystemTools::FileIsSymlink(l);
  local_41 = 0;
  bVar1 = false;
  if (!bVar2) {
    bVar2 = cmsys::SystemTools::FileIsSymlink(local_20);
    local_76 = false;
    if (!bVar2) goto LAB_0029f7af;
  }
  cmsys::SystemTools::GetRealPath(&local_40,r_local,(string *)0x0);
  local_41 = 1;
  cmsys::SystemTools::GetRealPath(&local_68,local_20,(string *)0x0);
  bVar1 = true;
  local_76 = std::operator==(&local_40,&local_68);
LAB_0029f7af:
  l_local._7_1_ = local_76;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (bool)(l_local._7_1_ & 1);
}

Assistant:

static bool cmLibDirsLinked(std::string const& l, std::string const& r)
{
  // Compare the real paths of the two directories.
  // Since our caller only changed the trailing component of each
  // directory, the real paths can be the same only if at least one of
  // the trailing components is a symlink.  Use this as an optimization
  // to avoid excessive realpath calls.
  return (cmSystemTools::FileIsSymlink(l) ||
          cmSystemTools::FileIsSymlink(r)) &&
    cmSystemTools::GetRealPath(l) == cmSystemTools::GetRealPath(r);
}